

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

int __thiscall
CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
          (map_bst<int,_int,_std::less<int>_> *this,node *n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  node *n_00;
  int iVar4;
  node *pnVar5;
  
  iVar3 = 0;
  while( true ) {
    if (n == (node *)0x0) {
      return iVar3 + -1;
    }
    n_00 = n->left;
    iVar4 = 0;
    if (n_00 == (node *)0x0) {
      iVar4 = 0;
      pnVar5 = n;
      do {
        n = pnVar5->right;
        if (n == (node *)0x0) goto LAB_001014e0;
        iVar4 = iVar4 + 1;
        n_00 = n->left;
        pnVar5 = n;
      } while (n_00 == (node *)0x0);
    }
    pnVar5 = n;
    if (n->right != (node *)0x0) break;
    iVar3 = iVar3 + iVar4 + 1;
    n = n_00;
  }
LAB_001014e0:
  iVar1 = shallowest_leaf(this,n_00);
  iVar2 = shallowest_leaf(this,pnVar5->right);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  return iVar3 + iVar1 + iVar4 + 1;
}

Assistant:

int CP::map_bst<KeyT,MappedT,CompareT>::shallowest_leaf(node* n) {
  if (n == nullptr) return -1;
  if (n->left == nullptr && n->right != nullptr) return 1 + shallowest_leaf(n->right);
  if (n->left != nullptr && n->right == nullptr) return 1 + shallowest_leaf(n->left);
  return 1 + std::min(shallowest_leaf(n->left), shallowest_leaf(n->right));
}